

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdgif.c
# Opt level: O3

JDIMENSION get_interlaced_row(j_compress_ptr cinfo,cjpeg_source_ptr sinfo)

{
  uint uVar1;
  _func_JDIMENSION_j_compress_ptr_cjpeg_source_ptr *p_Var2;
  JSAMPROW pJVar3;
  JSAMPARRAY ppJVar4;
  JDIMENSION JVar5;
  JSAMPROW pJVar6;
  long lVar7;
  ulong uVar8;
  
  uVar1 = sinfo[8].buffer_height;
  switch(uVar1 & 7) {
  case 0:
    JVar5 = uVar1 >> 3;
    break;
  default:
    JVar5 = (uVar1 >> 1) + *(int *)((long)&sinfo[9].start_input + 4);
    break;
  case 2:
  case 6:
    JVar5 = (uVar1 >> 2) + *(int *)&sinfo[9].start_input;
    break;
  case 4:
    JVar5 = (uVar1 >> 3) + *(int *)&sinfo[8].field_0x2c;
  }
  p_Var2 = sinfo[1].get_pixel_rows;
  ppJVar4 = (*cinfo->mem->access_virt_sarray)
                      ((j_common_ptr)cinfo,(jvirt_sarray_ptr)sinfo[8].buffer,JVar5,1,0);
  JVar5 = cinfo->image_width;
  if (JVar5 != 0) {
    pJVar6 = *sinfo->buffer;
    pJVar3 = *ppJVar4;
    lVar7 = 0;
    do {
      uVar8 = (ulong)pJVar3[lVar7];
      *pJVar6 = *(JSAMPLE *)(*(long *)p_Var2 + uVar8);
      pJVar6[1] = *(JSAMPLE *)(*(long *)(p_Var2 + 8) + uVar8);
      pJVar6[2] = *(JSAMPLE *)(*(long *)(p_Var2 + 0x10) + uVar8);
      lVar7 = lVar7 + 1;
      pJVar6 = pJVar6 + 3;
    } while (JVar5 != (JDIMENSION)lVar7);
  }
  sinfo[8].buffer_height = sinfo[8].buffer_height + 1;
  return 1;
}

Assistant:

METHODDEF(JDIMENSION)
get_interlaced_row(j_compress_ptr cinfo, cjpeg_source_ptr sinfo)
{
  gif_source_ptr source = (gif_source_ptr)sinfo;
  register int c;
  register JSAMPROW sptr, ptr;
  register JDIMENSION col;
  register JSAMPARRAY colormap = source->colormap;
  JDIMENSION irow;

  /* Figure out which row of interlaced image is needed, and access it. */
  switch ((int)(source->cur_row_number & 7)) {
  case 0:                       /* first-pass row */
    irow = source->cur_row_number >> 3;
    break;
  case 4:                       /* second-pass row */
    irow = (source->cur_row_number >> 3) + source->pass2_offset;
    break;
  case 2:                       /* third-pass row */
  case 6:
    irow = (source->cur_row_number >> 2) + source->pass3_offset;
    break;
  default:                      /* fourth-pass row */
    irow = (source->cur_row_number >> 1) + source->pass4_offset;
  }
  sptr = *(*cinfo->mem->access_virt_sarray)
    ((j_common_ptr)cinfo, source->interlaced_image, irow, (JDIMENSION)1,
     FALSE);
  /* Scan the row, expand colormap, and output */
  ptr = source->pub.buffer[0];
  for (col = cinfo->image_width; col > 0; col--) {
    c = *sptr++;
    *ptr++ = colormap[CM_RED][c];
    *ptr++ = colormap[CM_GREEN][c];
    *ptr++ = colormap[CM_BLUE][c];
  }
  source->cur_row_number++;     /* for next time */
  return 1;
}